

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv_signal_start(uv_signal_t *handle,uv_signal_cb signal_cb,int signum)

{
  uv_signal_t *puVar1;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int err;
  sigset_t saved_sigmask;
  uv_signal_s *in_stack_ffffffffffffff70;
  uv__signal_tree_s *in_stack_ffffffffffffff78;
  sigset_t *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((*(uint *)(in_RDI + 0x30) & 3) == 0) {
    if (in_EDX == 0) {
      local_4 = -0x16;
    }
    else if (in_EDX == *(int *)(in_RDI + 0x48)) {
      *(undefined8 *)(in_RDI + 0x40) = in_RSI;
      local_4 = 0;
    }
    else {
      if (*(int *)(in_RDI + 0x48) != 0) {
        uv__signal_stop((uv_signal_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
      }
      uv__signal_block_and_lock(in_stack_ffffffffffffffd0);
      puVar1 = uv__signal_first_handle(in_stack_ffffffffffffffdc);
      if ((puVar1 == (uv_signal_t *)0x0) &&
         (local_4 = uv__signal_register_handler((int)in_RDI), local_4 != 0)) {
        uv__signal_unlock_and_unblock((sigset_t *)0x11420c);
      }
      else {
        *(int *)(in_RDI + 0x48) = in_EDX;
        uv__signal_tree_s_RB_INSERT(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        uv__signal_unlock_and_unblock((sigset_t *)0x11424e);
        *(undefined8 *)(in_RDI + 0x40) = in_RSI;
        if (((*(uint *)(in_RDI + 0x30) & 0x4000) == 0) &&
           (*(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x4000,
           (*(uint *)(in_RDI + 0x30) & 0x2000) != 0)) {
          *(int *)(*(long *)(in_RDI + 0x10) + 8) = *(int *)(*(long *)(in_RDI + 0x10) + 8) + 1;
        }
        local_4 = 0;
      }
    }
    return local_4;
  }
  __assert_fail("!(handle->flags & (UV_CLOSING | UV_CLOSED))","src/unix/signal.c",0x123,
                "int uv_signal_start(uv_signal_t *, uv_signal_cb, int)");
}

Assistant:

int uv_signal_start(uv_signal_t* handle, uv_signal_cb signal_cb, int signum) {
  sigset_t saved_sigmask;
  int err;

  assert(!(handle->flags & (UV_CLOSING | UV_CLOSED)));

  /* If the user supplies signum == 0, then return an error already. If the
   * signum is otherwise invalid then uv__signal_register will find out
   * eventually.
   */
  if (signum == 0)
    return -EINVAL;

  /* Short circuit: if the signal watcher is already watching {signum} don't
   * go through the process of deregistering and registering the handler.
   * Additionally, this avoids pending signals getting lost in the small time
   * time frame that handle->signum == 0.
   */
  if (signum == handle->signum) {
    handle->signal_cb = signal_cb;
    return 0;
  }

  /* If the signal handler was already active, stop it first. */
  if (handle->signum != 0) {
    uv__signal_stop(handle);
  }

  uv__signal_block_and_lock(&saved_sigmask);

  /* If at this point there are no active signal watchers for this signum (in
   * any of the loops), it's time to try and register a handler for it here.
   */
  if (uv__signal_first_handle(signum) == NULL) {
    err = uv__signal_register_handler(signum);
    if (err) {
      /* Registering the signal handler failed. Must be an invalid signal. */
      uv__signal_unlock_and_unblock(&saved_sigmask);
      return err;
    }
  }

  handle->signum = signum;
  RB_INSERT(uv__signal_tree_s, &uv__signal_tree, handle);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signal_cb = signal_cb;
  uv__handle_start(handle);

  return 0;
}